

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.cxx
# Opt level: O0

void __thiscall cmLBDepend::GenerateDependInformation(cmLBDepend *this,cmDependInformation *info)

{
  cmMakefile *this_00;
  bool bVar1;
  __type _Var2;
  char *filename;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  cmSourceFile *this_01;
  string *psVar4;
  reference pbVar5;
  ulong uVar6;
  char *pcVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 local_d0 [8];
  string incpath;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a8;
  iterator t;
  allocator local_89;
  string local_88;
  string local_68;
  cmSourceFile *local_48;
  cmSourceFile *srcFile;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_38;
  const_iterator file;
  cmSourceFile *cFile;
  bool found;
  char *path;
  cmDependInformation *info_local;
  cmLBDepend *this_local;
  
  if ((info->DependDone & 1U) == 0) {
    info->DependDone = true;
    filename = (char *)std::__cxx11::string::c_str();
    if (filename == (char *)0x0) {
      cmSystemTools::Error
                ("Attempt to find dependencies for file without path!",(char *)0x0,(char *)0x0,
                 (char *)0x0);
    }
    else {
      cFile._7_1_ = cmsys::SystemTools::FileExists(filename,true);
      if (cFile._7_1_) {
        DependWalk(this,info);
      }
      if (info->SourceFile != (cmSourceFile *)0x0) {
        file._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)info->SourceFile;
        pvVar3 = cmSourceFile::GetDepends_abi_cxx11_((cmSourceFile *)file._M_current);
        bVar1 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty(pvVar3);
        if (!bVar1) {
          pvVar3 = cmSourceFile::GetDepends_abi_cxx11_((cmSourceFile *)file._M_current);
          local_38._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(pvVar3);
          while( true ) {
            pvVar3 = cmSourceFile::GetDepends_abi_cxx11_((cmSourceFile *)file._M_current);
            srcFile = (cmSourceFile *)
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::end(pvVar3);
            bVar1 = __gnu_cxx::operator!=
                              (&local_38,
                               (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&srcFile);
            if (!bVar1) break;
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator->(&local_38);
            pcVar7 = (char *)std::__cxx11::string::c_str();
            AddDependency(this,info,pcVar7);
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&local_38);
          }
          cFile._7_1_ = true;
        }
      }
      if (cFile._7_1_ == false) {
        this_00 = this->Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_88,filename,&local_89);
        cmsys::SystemTools::GetFilenameWithoutExtension(&local_68,&local_88);
        this_01 = cmMakefile::GetSource(this_00,&local_68);
        std::__cxx11::string::~string((string *)&local_68);
        std::__cxx11::string::~string((string *)&local_88);
        std::allocator<char>::~allocator((allocator<char> *)&local_89);
        local_48 = this_01;
        if (this_01 != (cmSourceFile *)0x0) {
          psVar4 = cmSourceFile::GetFullPath(this_01,(string *)0x0);
          bVar1 = std::operator==(psVar4,filename);
          if (bVar1) {
            cFile._7_1_ = true;
          }
          else {
            local_a8._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(&this->IncludeDirectories);
            while( true ) {
              incpath.field_2._8_8_ =
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end(&this->IncludeDirectories);
              bVar1 = __gnu_cxx::operator!=
                                (&local_a8,
                                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)((long)&incpath.field_2 + 8));
              if (!bVar1) break;
              pbVar5 = __gnu_cxx::
                       __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator*(&local_a8);
              std::__cxx11::string::string((string *)local_d0,(string *)pbVar5);
              uVar6 = std::__cxx11::string::empty();
              if ((uVar6 & 1) == 0) {
                std::__cxx11::string::size();
                pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_d0);
                if (*pcVar7 != '/') {
                  std::operator+(&local_f0,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_d0,"/");
                  std::__cxx11::string::operator=((string *)local_d0,(string *)&local_f0);
                  std::__cxx11::string::~string((string *)&local_f0);
                }
              }
              std::operator+(&local_110,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_d0,filename);
              std::__cxx11::string::operator=((string *)local_d0,(string *)&local_110);
              std::__cxx11::string::~string((string *)&local_110);
              psVar4 = cmSourceFile::GetFullPath(local_48,(string *)0x0);
              _Var2 = std::operator==(psVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_d0);
              if (_Var2) {
                std::__cxx11::string::operator=((string *)&info->FullPath,(string *)local_d0);
                cFile._7_1_ = true;
              }
              std::__cxx11::string::~string((string *)local_d0);
              __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&local_a8);
            }
          }
        }
      }
      if (cFile._7_1_ == false) {
        pcVar7 = (char *)std::__cxx11::string::c_str();
        bVar1 = cmsys::RegularExpression::find(&this->ComplainFileRegularExpression,pcVar7);
        if (bVar1) {
          cmSystemTools::Error
                    ("error cannot find dependencies for ",filename,(char *)0x0,(char *)0x0);
        }
        else {
          std::__cxx11::string::operator=((string *)&info->FullPath,"");
        }
      }
    }
  }
  return;
}

Assistant:

void GenerateDependInformation(cmDependInformation* info)
  {
    // If dependencies are already done, stop now.
    if(info->DependDone)
      {
      return;
      }
    else
      {
      // Make sure we don't visit the same file more than once.
      info->DependDone = true;
      }
    const char* path = info->FullPath.c_str();
    if(!path)
      {
      cmSystemTools::Error(
            "Attempt to find dependencies for file without path!");
      return;
      }

    bool found = false;

    // If the file exists, use it to find dependency information.
    if(cmSystemTools::FileExists(path, true))
      {
      // Use the real file to find its dependencies.
      this->DependWalk(info);
      found = true;
      }


    // See if the cmSourceFile for it has any files specified as
    // dependency hints.
    if(info->SourceFile != 0)
      {

      // Get the cmSourceFile corresponding to this.
      const cmSourceFile& cFile = *(info->SourceFile);
      // See if there are any hints for finding dependencies for the missing
      // file.
      if(!cFile.GetDepends().empty())
        {
        // Dependency hints have been given.  Use them to begin the
        // recursion.
        for(std::vector<std::string>::const_iterator file =
            cFile.GetDepends().begin(); file != cFile.GetDepends().end();
            ++file)
          {
          this->AddDependency(info, file->c_str());
          }

        // Found dependency information.  We are done.
        found = true;
        }
      }

    if(!found)
      {
      // Try to find the file amongst the sources
      cmSourceFile *srcFile = this->Makefile->GetSource
          (cmSystemTools::GetFilenameWithoutExtension(path));
      if (srcFile)
        {
        if (srcFile->GetFullPath() == path)
          {
          found=true;
          }
        else
          {
          //try to guess which include path to use
          for(std::vector<std::string>::iterator t =
              this->IncludeDirectories.begin();
              t != this->IncludeDirectories.end(); ++t)
            {
            std::string incpath = *t;
            if (!incpath.empty() && incpath[incpath.size() - 1] != '/')
              {
              incpath = incpath + "/";
              }
            incpath = incpath + path;
            if (srcFile->GetFullPath() == incpath)
              {
              // set the path to the guessed path
              info->FullPath = incpath;
              found=true;
              }
            }
          }
        }
      }

    if(!found)
      {
      // Couldn't find any dependency information.
      if(this->ComplainFileRegularExpression.find(info->IncludeName.c_str()))
        {
        cmSystemTools::Error("error cannot find dependencies for ", path);
        }
      else
        {
        // Destroy the name of the file so that it won't be output as a
        // dependency.
        info->FullPath = "";
        }
      }
  }